

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O0

int libj1939_get_timeout_ms(timespec *ts)

{
  timespec *in_RDI;
  int timeout_ms;
  int64_t time_diff;
  timespec curr_time;
  int local_24;
  int64_t local_20;
  timespec local_18;
  timespec *local_8;
  
  local_8 = in_RDI;
  clock_gettime(1,&local_18);
  local_20 = timespec_diff_ms(local_8,(timespec *)&local_18);
  if (local_20 < 0) {
    local_24 = 0;
  }
  else {
    if (0x7fffffff < local_20) {
      fprintf(_stderr,"timeout too long: %ld ms",local_20);
      local_20 = 0x7fffffff;
    }
    local_24 = (int)local_20;
  }
  return local_24;
}

Assistant:

static int libj1939_get_timeout_ms(struct timespec *ts)
{
	struct timespec curr_time;
	int64_t time_diff;
	int timeout_ms;

	clock_gettime(CLOCK_MONOTONIC, &curr_time);
	time_diff = timespec_diff_ms(ts, &curr_time);
	if (time_diff < 0) {
		/* Too late to send next message. Send it now */
		timeout_ms = 0;
	} else {
		if (time_diff > INT_MAX) {
			pr_warn("timeout too long: %" PRId64 " ms", time_diff);
			time_diff = INT_MAX;
		}

		timeout_ms = time_diff;
	}

	return timeout_ms;
}